

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O1

pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* helics::core::extractCoreType
            (pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *configureString)

{
  string_view type;
  ConfigType CVar1;
  CoreType CVar2;
  string_view configString;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  string namestring;
  string corestring;
  istringstream jstring;
  char *in_stack_fffffffffffffd78;
  helicsCLI11App *local_280;
  string local_278;
  string local_258;
  undefined1 local_238 [520];
  
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  anon_unknown_5::makeCLITypeApp((anon_unknown_5 *)&local_280,&local_258,&local_278);
  configString._M_str = (configureString->_M_dataplus)._M_p;
  configString._M_len = configureString->_M_string_length;
  CVar1 = fileops::getConfigType(configString);
  switch(CVar1) {
  case JSON_STRING:
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_238,(string *)configureString,_S_in);
    CLI::App::parse_from_stream(&local_280->super_App,(istream *)local_238);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
    std::ios_base::~ios_base((ios_base *)(local_238 + 0x78));
    break;
  case JSON_FILE:
    std::ifstream::ifstream(local_238,(string *)configureString,_S_in);
    CLI::App::parse_from_stream(&local_280->super_App,(istream *)local_238);
    std::ifstream::~ifstream(local_238);
    break;
  case TOML_STRING:
    (local_280->super_App).allow_extras_ = true;
    CLI::App::get_config_formatter_base((App *)local_238);
    if ((_func_int **)local_238._0_8_ != (_func_int **)0x0) {
      *(undefined1 *)(local_238._0_8_ + 0x50) = 1;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_238,(string *)configureString,_S_in);
    CLI::App::parse_from_stream(&local_280->super_App,(istream *)local_238);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
    std::ios_base::~ios_base((ios_base *)(local_238 + 0x78));
    goto LAB_0037321f;
  case TOML_FILE:
    (local_280->super_App).allow_extras_ = true;
    CLI::App::get_config_formatter_base((App *)local_238);
    if ((_func_int **)local_238._0_8_ != (_func_int **)0x0) {
      *(undefined1 *)(local_238._0_8_ + 0x50) = 1;
    }
    std::ifstream::ifstream(local_238,(string *)configureString,_S_in);
    CLI::App::parse_from_stream(&local_280->super_App,(istream *)local_238);
    std::ifstream::~ifstream(local_238);
LAB_0037321f:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    break;
  case CMD_LINE:
    helicsCLI11App::helics_parse<std::__cxx11::string_const&>(local_280,configureString);
  }
  if (local_258._M_string_length == 0) {
    __return_storage_ptr__->first = DEFAULT;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
  }
  else {
    type._M_str = in_stack_fffffffffffffd78;
    type._M_len = 0x37326d;
    CVar2 = coreTypeFromString(type);
    __return_storage_ptr__->first = CVar2;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
  }
  if (local_280 != (helicsCLI11App *)0x0) {
    (*(local_280->super_App)._vptr_App[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<CoreType, std::string> extractCoreType(const std::string& configureString)
{
    std::string corestring;
    std::string namestring;
    auto app = makeCLITypeApp(corestring, namestring);
    auto type = fileops::getConfigType(configureString);
    try {
        switch (type) {
            case fileops::ConfigType::JSON_FILE: {
                std::ifstream file{configureString};
                app->parse_from_stream(file);
                break;
            }
            case fileops::ConfigType::JSON_STRING: {
                std::istringstream jstring{configureString};
                app->parse_from_stream(jstring);
                break;
            }
            case fileops::ConfigType::TOML_FILE: {
                app->allow_extras();
                auto dptr =
                    std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
                if (dptr) {
                    dptr->skipJson(true);
                }
                std::ifstream file{configureString};
                app->parse_from_stream(file);
                break;
            }
            case fileops::ConfigType::TOML_STRING: {
                app->allow_extras();
                auto dptr =
                    std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
                if (dptr) {
                    dptr->skipJson(true);
                }
                std::istringstream tstring{configureString};
                app->parse_from_stream(tstring);
                break;
            }
            case fileops::ConfigType::CMD_LINE:
                app->helics_parse(configureString);
                break;
            case fileops::ConfigType::NONE:
                break;
        }
    }
    catch (const std::exception&) {
        corestring.clear();
    }
    if (corestring.empty()) {
        return {CoreType::DEFAULT, namestring};
    }
    return {coreTypeFromString(corestring), namestring};
}